

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeFaceWrapper.cpp
# Opt level: O0

bool __thiscall
FreeTypeFaceWrapper::IsCharachterCodeAdobeStandard
          (FreeTypeFaceWrapper *this,FT_ULong inCharacterCode)

{
  bool bVar1;
  FT_ULong inCharacterCode_local;
  FreeTypeFaceWrapper *this_local;
  
  if (inCharacterCode < 0x20) {
    this_local._7_1_ = true;
  }
  else {
    bVar1 = betweenIncluding<unsigned_long>(inCharacterCode,0x20,0x7e);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      bVar1 = betweenIncluding<unsigned_long>(inCharacterCode,0xa1,0xac);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        bVar1 = betweenIncluding<unsigned_long>(inCharacterCode,0xae,0xb2);
        if (bVar1) {
          this_local._7_1_ = true;
        }
        else {
          bVar1 = betweenIncluding<unsigned_long>(inCharacterCode,0xb4,0xbd);
          if (bVar1) {
            this_local._7_1_ = true;
          }
          else {
            bVar1 = betweenIncluding<unsigned_long>(inCharacterCode,0xbf,0xff);
            if (bVar1) {
              this_local._7_1_ = true;
            }
            else if (inCharacterCode == 0x131) {
              this_local._7_1_ = true;
            }
            else {
              bVar1 = betweenIncluding<unsigned_long>(inCharacterCode,0x141,0x142);
              if (bVar1) {
                this_local._7_1_ = true;
              }
              else {
                bVar1 = betweenIncluding<unsigned_long>(inCharacterCode,0x152,0x153);
                if (bVar1) {
                  this_local._7_1_ = true;
                }
                else {
                  bVar1 = betweenIncluding<unsigned_long>(inCharacterCode,0x160,0x161);
                  if (bVar1) {
                    this_local._7_1_ = true;
                  }
                  else if (inCharacterCode == 0x178) {
                    this_local._7_1_ = true;
                  }
                  else {
                    bVar1 = betweenIncluding<unsigned_long>(inCharacterCode,0x17d,0x17e);
                    if (bVar1) {
                      this_local._7_1_ = true;
                    }
                    else if (inCharacterCode == 0x192) {
                      this_local._7_1_ = true;
                    }
                    else {
                      bVar1 = betweenIncluding<unsigned_long>(inCharacterCode,0x2c6,0x1c7);
                      if (bVar1) {
                        this_local._7_1_ = true;
                      }
                      else {
                        bVar1 = betweenIncluding<unsigned_long>(inCharacterCode,0x2da,0x1db);
                        if (bVar1) {
                          this_local._7_1_ = true;
                        }
                        else if (inCharacterCode == 0x2dd) {
                          this_local._7_1_ = true;
                        }
                        else {
                          bVar1 = betweenIncluding<unsigned_long>(inCharacterCode,0x2d8,0x1d9);
                          if (bVar1) {
                            this_local._7_1_ = true;
                          }
                          else {
                            bVar1 = betweenIncluding<unsigned_long>(inCharacterCode,0x2013,0x2014);
                            if (bVar1) {
                              this_local._7_1_ = true;
                            }
                            else {
                              bVar1 = betweenIncluding<unsigned_long>(inCharacterCode,0x2018,0x201a)
                              ;
                              if (bVar1) {
                                this_local._7_1_ = true;
                              }
                              else {
                                bVar1 = betweenIncluding<unsigned_long>
                                                  (inCharacterCode,0x201c,0x201e);
                                if (bVar1) {
                                  this_local._7_1_ = true;
                                }
                                else {
                                  bVar1 = betweenIncluding<unsigned_long>
                                                    (inCharacterCode,0x2022,0x2021);
                                  if (bVar1) {
                                    this_local._7_1_ = true;
                                  }
                                  else if (inCharacterCode == 0x2026) {
                                    this_local._7_1_ = true;
                                  }
                                  else if (inCharacterCode == 0x2030) {
                                    this_local._7_1_ = true;
                                  }
                                  else {
                                    bVar1 = betweenIncluding<unsigned_long>
                                                      (inCharacterCode,0x2039,0x203a);
                                    if (bVar1) {
                                      this_local._7_1_ = true;
                                    }
                                    else if (inCharacterCode == 0x2044) {
                                      this_local._7_1_ = true;
                                    }
                                    else if (inCharacterCode == 0x20ac) {
                                      this_local._7_1_ = true;
                                    }
                                    else if (inCharacterCode == 0x2122) {
                                      this_local._7_1_ = true;
                                    }
                                    else {
                                      bVar1 = betweenIncluding<unsigned_long>
                                                        (inCharacterCode,0xfb01,0xfb02);
                                      if (bVar1) {
                                        this_local._7_1_ = true;
                                      }
                                      else {
                                        this_local._7_1_ = false;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool FreeTypeFaceWrapper::IsCharachterCodeAdobeStandard(FT_ULong inCharacterCode)
{
	// Comparing character code to unicode value of codes in Adobe Standard Latin
	if(inCharacterCode < 0x20) // ignore control charachters
		return true;

	if(betweenIncluding<FT_ULong>(inCharacterCode,0x20,0x7E))
		return true;
	if(betweenIncluding<FT_ULong>(inCharacterCode,0xA1,0xAC))
		return true;
	if(betweenIncluding<FT_ULong>(inCharacterCode,0xAE,0xB2))
		return true;
	if(betweenIncluding<FT_ULong>(inCharacterCode,0xB4,0xBD))
		return true;
	if(betweenIncluding<FT_ULong>(inCharacterCode,0xBF,0xFF))
		return true;
	if(0x131 == inCharacterCode)
		return true;
	if(betweenIncluding<FT_ULong>(inCharacterCode,0x141,0x142))
		return true;
	if(betweenIncluding<FT_ULong>(inCharacterCode,0x152,0x153))
		return true;
	if(betweenIncluding<FT_ULong>(inCharacterCode,0x160,0x161))
		return true;
	if(0x178 == inCharacterCode)
		return true;
	if(betweenIncluding<FT_ULong>(inCharacterCode,0x17D,0x17E))
		return true;
	if(0x192 == inCharacterCode)
		return true;
	if(betweenIncluding<FT_ULong>(inCharacterCode,0x2C6,0x1C7))
		return true;
	if(betweenIncluding<FT_ULong>(inCharacterCode,0x2DA,0x1DB))
		return true;
	if(0x2DD == inCharacterCode)
		return true;
	if(betweenIncluding<FT_ULong>(inCharacterCode,0x2D8,0x1D9))
		return true;
	if(betweenIncluding<FT_ULong>(inCharacterCode,0x2013,0x2014))
		return true;
	if(betweenIncluding<FT_ULong>(inCharacterCode,0x2018,0x201A))
		return true;
	if(betweenIncluding<FT_ULong>(inCharacterCode,0x201C,0x201E))
		return true;
	if(betweenIncluding<FT_ULong>(inCharacterCode,0x2022,0x2021))
		return true;
	if(0x2026 == inCharacterCode)
		return true;
	if(0x2030 == inCharacterCode)
		return true;
	if(betweenIncluding<FT_ULong>(inCharacterCode,0x2039,0x203A))
		return true;
	if(0x2044 == inCharacterCode)
		return true;
	if(0x20AC == inCharacterCode)
		return true;
	if(0x2122 == inCharacterCode)
		return true;
	if(betweenIncluding<FT_ULong>(inCharacterCode,0xFB01,0xFB02))
		return true;
	return false;
}